

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::uconv_converter::uconv_converter(uconv_converter *this,string *encoding)

{
  UBool UVar1;
  char cVar2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  string *in_RSI;
  base_converter *in_RDI;
  UErrorCode err;
  string local_40 [8];
  string *in_stack_ffffffffffffffc8;
  invalid_charset_error *in_stack_ffffffffffffffd0;
  UErrorCode local_20 [4];
  string *local_10;
  
  local_10 = in_RSI;
  util::base_converter::base_converter(in_RDI);
  in_RDI->_vptr_base_converter = (_func_int **)&PTR__uconv_converter_002ea8f8;
  std::__cxx11::string::string((string *)(in_RDI + 1),local_10);
  local_20[0] = U_ZERO_ERROR;
  uVar3 = std::__cxx11::string::c_str();
  pp_Var4 = (_func_int **)ucnv_open_70(uVar3,local_20);
  in_RDI[5]._vptr_base_converter = pp_Var4;
  ucnv_setFromUCallBack_70
            (in_RDI[5]._vptr_base_converter,UCNV_FROM_U_CALLBACK_STOP_70,0,0,0,local_20);
  ucnv_setToUCallBack_70(in_RDI[5]._vptr_base_converter,UCNV_TO_U_CALLBACK_STOP_70,0,0,0,local_20);
  if (in_RDI[5]._vptr_base_converter != (_func_int **)0x0) {
    UVar1 = U_FAILURE(local_20[0]);
    if (UVar1 == '\0') {
      cVar2 = ucnv_getMaxCharSize_70(in_RDI[5]._vptr_base_converter);
      *(int *)&in_RDI[6]._vptr_base_converter = (int)cVar2;
      return;
    }
  }
  if (in_RDI[5]._vptr_base_converter != (_func_int **)0x0) {
    ucnv_close_70(in_RDI[5]._vptr_base_converter);
  }
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_40,local_10);
  conv::invalid_charset_error::invalid_charset_error
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __cxa_throw(uVar3,&conv::invalid_charset_error::typeinfo,
              conv::invalid_charset_error::~invalid_charset_error);
}

Assistant:

uconv_converter(std::string const &encoding) :
            encoding_(encoding)
        {
            UErrorCode err=U_ZERO_ERROR;
            
            // No need to check err each time, this
            // is how ICU works.
            cvt_ = ucnv_open(encoding.c_str(),&err);
            ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_STOP,0,0,0,&err);
            ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_STOP,0,0,0,&err);

            if(!cvt_ || U_FAILURE(err)) {
                if(cvt_)
                    ucnv_close(cvt_);
                throw conv::invalid_charset_error(encoding);
            }
            
            max_len_ = ucnv_getMaxCharSize(cvt_);
        }